

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

ssize_t __thiscall
JSON::JSON_dictionary::write(JSON_dictionary *this,int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  _Rb_tree_node_base *p_Var1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  undefined8 uStack_38;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  uStack_38 = in_RAX;
  Pipeline::operator<<(this_00,"{");
  uStack_38._7_1_ = true;
  for (p_Var1 = (this->members)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->members)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    writeDictionaryItem(this_00,(bool *)((long)&uStack_38 + 7),(string *)(p_Var1 + 1),
                        (JSON *)(p_Var1 + 2),(long)__buf + 1);
  }
  writeDictionaryClose(this_00,(bool)uStack_38._7_1_,(size_t)__buf);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_dictionary::write(Pipeline* p, size_t depth) const
{
    bool first = true;
    writeDictionaryOpen(p, first, depth);
    for (auto const& iter: members) {
        writeDictionaryItem(p, first, iter.first, iter.second, 1 + depth);
    }
    writeDictionaryClose(p, first, depth);
}